

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall CVmObjGramProd::find_literal_in_alts(CVmObjGramProd *this,char *str,size_t len)

{
  vmgram_alt_info *pvVar1;
  int iVar2;
  vm_gram_ext *pvVar3;
  vm_prop_id_t *in_RDX;
  void *in_RSI;
  CVmObjGramProd *in_RDI;
  size_t j;
  vmgram_tok_info *tok;
  vmgram_alt_info *alt;
  size_t i;
  ulong local_40;
  vmgram_tok_info *local_38;
  ulong local_28;
  
  local_28 = 0;
  do {
    pvVar3 = get_ext(in_RDI);
    if (pvVar3->alt_cnt_ <= local_28) {
      return 0;
    }
    pvVar3 = get_ext(in_RDI);
    pvVar1 = pvVar3->alts_[local_28];
    if (pvVar1->del == 0) {
      local_38 = pvVar1->toks;
      for (local_40 = 0; local_40 < pvVar1->tok_cnt; local_40 = local_40 + 1) {
        if (((local_38->typ == '\x03') && ((local_38->typinfo).nspeech.props == in_RDX)) &&
           (iVar2 = memcmp((local_38->typinfo).lit.str,in_RSI,(size_t)in_RDX), iVar2 == 0)) {
          return 1;
        }
        local_38 = local_38 + 1;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int CVmObjGramProd::find_literal_in_alts(const char *str, size_t len)
{
    /* 
     *   Scan the surviving alternatives to see if this same literal token
     *   appears in any of them.  If not, it's no longer in use in the
     *   production, so delete it from the dictionary.  
     */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
    {
        /* get this item */
        vmgram_alt_info *alt = get_ext()->alts_[i];
        
        /* if it's being deleted, skip it */
        if (alt->del)
            continue;

        /* it's still alive - scan its tokens */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* if this is a matching literal, the word is still in use */
            if (tok->typ == VMGRAM_MATCH_LITERAL
                && tok->typinfo.lit.len == len
                && memcmp(tok->typinfo.lit.str, str, len) == 0)
                return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}